

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# J2CLItableMerging.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
anon_func::Rerouter::create(Rerouter *this)

{
  J2CLItableMerging *parent;
  Rerouter *this_00;
  long in_RSI;
  
  parent = *(J2CLItableMerging **)(in_RSI + 0x130);
  this_00 = (Rerouter *)operator_new(0x138);
  ::wasm::(anonymous_namespace)::J2CLItableMerging::rerouteItableAccess(wasm::Module&)::Rerouter::
  Rerouter(wasm::(anonymous)::J2CLItableMerging__(this_00,parent);
  (this->super_WalkerPass<wasm::PostWalker<Rerouter,_wasm::Visitor<Rerouter,_void>_>_>).super_Pass.
  _vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Rerouter>(parent);
      }